

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

char * sha256_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  undefined1 local_88 [8];
  SHA256_CTX context;
  char *digest_local;
  size_t len_local;
  sha2_byte *data_local;
  
  context.buffer._56_8_ = digest;
  sha256_Init((SHA256_CTX *)local_88);
  sha256_Update((SHA256_CTX *)local_88,data,len);
  pcVar1 = sha256_End((SHA256_CTX *)local_88,(char *)context.buffer._56_8_);
  return pcVar1;
}

Assistant:

char* sha256_Data(const sha2_byte* data, size_t len, char digest[SHA256_DIGEST_STRING_LENGTH]) {
    trezor::SHA256_CTX	context;

	sha256_Init(&context);
	sha256_Update(&context, data, len);
	return sha256_End(&context, digest);
}